

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nls.c
# Opt level: O1

void qrsolv(double *r,int ldr,int N,int *ipvt,double *diag,double *qtb,double *x,double *sdiag)

{
  double dVar1;
  int iVar2;
  int iVar3;
  void *__ptr;
  double *pdVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  long lVar10;
  double *pdVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double *local_80;
  long local_78;
  
  uVar12 = (ulong)(uint)N;
  __ptr = malloc((long)N * 8);
  if (0 < N) {
    uVar6 = 0;
    uVar9 = 0;
    uVar7 = uVar12;
    pdVar8 = r;
    pdVar4 = r;
    do {
      uVar13 = 0;
      pdVar11 = pdVar8;
      do {
        *pdVar11 = pdVar4[uVar6 + uVar13];
        uVar13 = uVar13 + 1;
        pdVar11 = pdVar11 + uVar12;
      } while (uVar7 != uVar13);
      x[uVar9] = r[(N + 1) * (int)uVar9];
      *(double *)((long)__ptr + uVar9 * 8) = qtb[uVar9];
      uVar9 = uVar9 + 1;
      pdVar4 = pdVar4 + 1;
      uVar6 = uVar6 + N;
      pdVar8 = pdVar8 + uVar12 + 1;
      uVar7 = uVar7 - 1;
    } while (uVar9 != uVar12);
  }
  if (0 < N) {
    local_80 = r + uVar12;
    local_78 = 1;
    uVar7 = 0;
    do {
      iVar3 = ipvt[uVar7];
      if ((diag[iVar3] != 0.0) || (NAN(diag[iVar3]))) {
        memset(sdiag + uVar7,0,(ulong)(~(uint)uVar7 + N) * 8 + 8);
        sdiag[uVar7] = diag[iVar3];
        dVar17 = 0.0;
        uVar9 = uVar7;
        pdVar8 = local_80;
        lVar14 = local_78;
        do {
          dVar15 = sdiag[uVar9];
          if ((dVar15 != 0.0) || (NAN(dVar15))) {
            iVar3 = (N + 1) * (int)uVar9;
            dVar18 = r[iVar3];
            if (ABS(dVar15) <= ABS(dVar18)) {
              dVar15 = dVar15 / dVar18;
              dVar18 = dVar15 * 0.25 * dVar15 + 0.25;
              if (dVar18 < 0.0) {
                dVar18 = sqrt(dVar18);
              }
              else {
                dVar18 = SQRT(dVar18);
              }
              dVar18 = 0.5 / dVar18;
              dVar15 = dVar15 * dVar18;
            }
            else {
              dVar18 = dVar18 / dVar15;
              dVar15 = dVar18 * 0.25 * dVar18 + 0.25;
              if (dVar15 < 0.0) {
                dVar15 = sqrt(dVar15);
              }
              else {
                dVar15 = SQRT(dVar15);
              }
              dVar15 = 0.5 / dVar15;
              dVar18 = dVar18 * dVar15;
            }
            r[iVar3] = r[iVar3] * dVar18 + sdiag[uVar9] * dVar15;
            dVar1 = *(double *)((long)__ptr + uVar9 * 8);
            dVar16 = dVar17 * dVar15;
            dVar17 = dVar17 * dVar18 - dVar1 * dVar15;
            *(double *)((long)__ptr + uVar9 * 8) = dVar18 * dVar1 + dVar16;
            if (uVar9 + 1 < uVar12 && uVar9 + 2 <= uVar12) {
              pdVar4 = pdVar8;
              lVar5 = lVar14;
              do {
                dVar1 = *pdVar4;
                dVar16 = sdiag[lVar5];
                sdiag[lVar5] = dVar1 * -dVar15 + dVar16 * dVar18;
                *pdVar4 = dVar18 * dVar1 + dVar15 * dVar16;
                lVar5 = lVar5 + 1;
                pdVar4 = pdVar4 + uVar12;
              } while ((int)lVar5 < N);
            }
          }
          uVar9 = uVar9 + 1;
          lVar14 = lVar14 + 1;
          pdVar8 = pdVar8 + uVar12 + 1;
        } while (uVar9 != uVar12);
      }
      iVar3 = (N + 1) * (uint)uVar7;
      sdiag[uVar7] = r[iVar3];
      r[iVar3] = x[uVar7];
      uVar7 = uVar7 + 1;
      local_78 = local_78 + 1;
      local_80 = local_80 + uVar12 + 1;
    } while (uVar7 != uVar12);
  }
  uVar6 = N;
  if (0 < N) {
    uVar9 = 0;
    uVar7 = (ulong)(uint)N;
    do {
      uVar13 = uVar9 & 0xffffffff;
      if (sdiag[uVar9] != 0.0) {
        uVar13 = uVar7;
      }
      if (NAN(sdiag[uVar9])) {
        uVar13 = uVar7;
      }
      if ((int)uVar7 != N) {
        uVar13 = uVar7;
      }
      uVar6 = (uint)uVar13;
      if ((int)uVar6 < N) {
        *(undefined8 *)((long)__ptr + uVar9 * 8) = 0;
      }
      uVar9 = uVar9 + 1;
      uVar7 = uVar13;
    } while (uVar12 != uVar9);
  }
  if (0 < (int)uVar6) {
    iVar3 = (N + 1) * uVar6 + -1;
    uVar7 = 1;
    lVar14 = 0;
    do {
      lVar10 = uVar6 - uVar7;
      dVar17 = 0.0;
      lVar5 = lVar14;
      iVar2 = iVar3;
      if (lVar10 <= (long)((ulong)uVar6 - 2)) {
        do {
          dVar17 = dVar17 + r[iVar2] *
                            *(double *)((long)__ptr + lVar5 * 8 + (long)(int)(uVar6 + 1) * 8 + -8);
          lVar5 = lVar5 + 1;
          iVar2 = iVar2 + N;
        } while ((int)lVar5 != 0);
      }
      *(double *)((long)__ptr + lVar10 * 8) =
           (*(double *)((long)__ptr + lVar10 * 8) - dVar17) / sdiag[lVar10];
      uVar7 = uVar7 + 1;
      iVar3 = iVar3 + ~N;
      lVar14 = lVar14 + -1;
    } while (uVar7 != uVar6 + 1);
  }
  if (0 < N) {
    uVar7 = 0;
    do {
      x[ipvt[uVar7]] = *(double *)((long)__ptr + uVar7 * 8);
      uVar7 = uVar7 + 1;
    } while (uVar12 != uVar7);
  }
  free(__ptr);
  return;
}

Assistant:

void qrsolv(double *r,int ldr,int N,int *ipvt,double *diag,double *qtb,double *x,double *sdiag) {
	int i,j,jp1,k,kp1,l,nsing,t;
	double cos,cotan,p5,p25,qtbpj,sin,sum,tan,temp,zero;
	double *wa;

	/*
	 *   This routine is a C translation of Fortran Code by
     *     argonne national laboratory. minpack project. march 1980.
      	  burton s. garbow, kenneth e. hillstrom, jorge j. more
	 * N is a positive integer input variable set to the order of r.

       r is an N by N array. on input the full upper triangle
         must contain the full upper triangle of the matrix r.
         on output the full upper triangle is unaltered, and the
         strict lower triangle contains the strict upper triangle
         (transposed) of the upper triangular matrix s.

       ldr is a positive integer input variable not less than n
         which specifies the leading dimension of the array r.

       ipvt is an integer input array of length N which defines the
         permutation matrix p such that a*p = q*r. column j of p
         is column ipvt(j) of the identity matrix.

       diag is an input array of length N which must contain the
         diagonal elements of the matrix d.

       qtb is an input array of length N which must contain the first
         N elements of the vector (q transpose)*b.

       x is an output array of length N which contains the least
         squares solution of the system a*x = b, d*x = 0.

       sdiag is an output array of length N which contains the
         diagonal elements of the upper triangular matrix s.
	 */

	wa = (double*) malloc(sizeof(double) *N);

	p5 = 5.0e-1;
	p25 = 2.5e-1;
	zero = 0.0;

	//     copy r and (q transpose)*b to preserve input and initialize s.
	//     in particular, save the diagonal elements of r in x.

	for(j = 0; j < N;++j) {
		for(i = j; i < N;++i) {
			r[i*N+j] = r[j*N+i];
		}
		x[j] = r[j*N+j];
		wa[j] = qtb[j];
	}

	//eliminate the diagonal matrix d using a givens rotation.

	for(j = 0; j < N;++j) { //100

		//        prepare the row of d to be eliminated, locating the
		//        diagonal element using p from the qr factorization.

		l = ipvt[j];

		if (diag[l] != zero) { //90
			for(k = j; k < N;++k) {
				sdiag[k] = zero;
			}

			sdiag[j] = diag[l];

			//        the transformations to eliminate the row of d
			//        modify only a single element of (q transpose)*b
			//        beyond the first n, which is initially zero.

			qtbpj = zero;

			for(k = j; k < N;++k) { //80
				t = k * N;
				//     determine a givens rotation which eliminates the
				//     appropriate element in the current row of d.

				if (sdiag[k] != zero) { //70
					if (fabs(r[t+k]) < fabs(sdiag[k])) {
						cotan = r[t+k]/sdiag[k];
			            sin = p5/sqrt(p25+p25*cotan*cotan);
			            cos = sin*cotan;
					} else {
			            tan = sdiag[k]/r[t+k];
			            cos = p5/sqrt(p25+p25*tan*tan);
			            sin = cos*tan;
					}
					//           compute the modified diagonal element of r and
					//           the modified element of ((q transpose)*b,0).
		            r[t+k] = cos*r[t+k] + sin*sdiag[k];
		            temp = cos*wa[k] + sin*qtbpj;
		            qtbpj = -sin*wa[k] + cos*qtbpj;
		            wa[k] = temp;

		            //           accumulate the tranformation in the row of s.
		            kp1 = k + 1;

		            if (N >= kp1+1) {//71
		            	for(i = kp1;i < N;++i) {
		                    temp = cos*r[i*N+k] + sin*sdiag[i];
		                    sdiag[i] = -sin*r[i*N+k] + cos*sdiag[i];
		                    r[i*N+k] = temp;
		            	}
		            }//71
				}//70
			}//80
		} //90
		//        store the diagonal element of s and restore
		//        the corresponding diagonal element of r.

        sdiag[j] = r[j*N+j];
        r[j*N+j] = x[j];

	}//100

	//     solve the triangular system for z. if the system is
	//     singular, then obtain a least squares solution.

	nsing = N;

	for(j = 1; j <= N;++j) {
		if (sdiag[j-1] == zero && nsing == N) {
			nsing = j - 1;
		}
		if (nsing < N) {
			wa[j-1] = zero;
		}
	}

	if (nsing >= 1) {//150
		for(k = 1; k <= nsing;++k) {
	         j = nsing - k + 1;
	         sum = zero;
	         jp1 = j + 1;

	         if (nsing >= jp1) {
	        	 for (i = jp1; i <= nsing;++i) {
	        		 sum = sum + r[(i-1)*N+j-1]*wa[i-1];
	        	 }
	         }
	         wa[j-1] = (wa[j-1] - sum)/sdiag[j-1];
		}
	}//150

	//     permute the components of z back to components of x.

	for (j = 0; j < N;++j) {
        l = ipvt[j];
        x[l] = wa[j];
	}


	free(wa);
}